

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char *__src;
  char *res;
  string local_80 [8];
  string result;
  allocator local_49;
  undefined1 local_48 [8];
  string barf;
  cmMakefile *mf;
  int atOnly_local;
  int escapeQuotes_local;
  char *source_local;
  void *arg_local;
  
  barf.field_2._8_8_ = arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,source,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = cmMakefile::ExpandVariablesInString
                     ((cmMakefile *)barf.field_2._8_8_,(string *)local_48,escapeQuotes != 0,
                      atOnly != 0,false,(char *)0x0,-1,false,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,(allocator *)((long)&res + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&res + 7));
  lVar2 = std::__cxx11::string::size();
  pcVar1 = (char *)malloc(lVar2 + 1);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar1,__src);
  }
  lVar2 = std::__cxx11::string::size();
  pcVar1[lVar2] = '\0';
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)local_48);
  return pcVar1;
}

Assistant:

char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                      int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string result = mf->ExpandVariablesInString(
    barf, (escapeQuotes ? true : false), (atOnly ? true : false));
  char* res = static_cast<char*>(malloc(result.size() + 1));
  if (!result.empty()) {
    strcpy(res, result.c_str());
  }
  res[result.size()] = '\0';
  return res;
}